

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e58190::HandleStringsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint j;
  PolicyStatus PVar7;
  BOM BVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  string *psVar12;
  string *a;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  PolicyID id;
  pointer pbVar17;
  ulong uVar18;
  char cVar19;
  undefined4 uVar20;
  size_type sVar21;
  uint j_1;
  undefined4 uVar22;
  string_view value;
  int limit_output;
  uint local_538;
  uint local_534;
  undefined8 local_530;
  ulong local_528;
  uint local_520;
  int limit_input;
  string s;
  uint local_4f8;
  ulong local_4f0;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  string fileName;
  ifstream fin;
  undefined7 uStack_467;
  uint auStack_448 [122];
  RegularExpression regex;
  
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&regex,"STRINGS requires a file name and output variable",
               (allocator<char> *)&fin);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&regex);
    return false;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)(pbVar17 + 1));
  bVar4 = cmsys::SystemTools::FileIsFullPath(&fileName);
  if (!bVar4) {
    psVar12 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    fin = (ifstream)0x2f;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              ((string *)&regex,psVar12,(char *)&fin,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&regex);
    std::__cxx11::string::~string((string *)&regex);
  }
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  limit_input = -1;
  limit_output = -1;
  regex.regmust = (char *)0x0;
  regex.program = (char *)0x0;
  psVar12 = pbVar17 + 2;
  regex.progsize = 0;
  memset(&regex,0,0x20a);
  bVar4 = true;
  bVar6 = false;
  local_530 = (pointer)((ulong)local_530._4_4_ << 0x20);
  uVar22 = 0;
  local_538 = 1;
  local_534 = 0;
  local_4f0 = 0;
  local_520 = 0;
  local_4f8 = 0;
  for (uVar13 = 3;
      uVar13 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar17 >> 5);
      uVar13 = (ulong)((int)uVar13 + 1)) {
    bVar5 = std::operator==(pbVar17 + uVar13,"LIMIT_INPUT");
    if (bVar5) {
      uVar22 = 1;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LIMIT_OUTPUT");
    if (bVar5) {
      uVar22 = 2;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LIMIT_COUNT");
    if (bVar5) {
      uVar22 = 3;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LENGTH_MINIMUM");
    if (bVar5) {
      uVar22 = 4;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"LENGTH_MAXIMUM");
    if (bVar5) {
      uVar22 = 5;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"REGEX");
    if (bVar5) {
      uVar22 = 7;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"NEWLINE_CONSUME");
    if (bVar5) {
      bVar6 = true;
      uVar22 = 0;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"NO_HEX_CONVERSION")
    ;
    uVar20 = 0;
    if (bVar5) {
      bVar4 = false;
      uVar22 = 0;
      goto LAB_00337ee9;
    }
    bVar5 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar13,"ENCODING");
    if (bVar5) {
      uVar22 = 8;
      goto LAB_00337ee9;
    }
    puVar16 = &switchD_00337f6f::switchdataD_00740f70;
    switch(uVar22) {
    case 1:
      uVar22 = 0;
      iVar9 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&limit_input);
      if ((iVar9 != 1) || (limit_input < 0)) {
        cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)&fin,(char (*) [35])"STRINGS option LIMIT_INPUT value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar13,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00338b39;
      }
      break;
    case 2:
      uVar22 = 0;
      iVar9 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&limit_output);
      if ((iVar9 != 1) || (limit_output < 0)) {
        cmStrCat<char_const(&)[36],std::__cxx11::string_const&,char_const(&)[30]>
                  ((string *)&fin,(char (*) [36])"STRINGS option LIMIT_OUTPUT value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar13,
                   (char (*) [30])"\" is not an unsigned integer.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00338b39;
      }
      break;
    case 3:
      iVar9 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&s);
      if (iVar9 == 1) {
        local_4f0 = (ulong)s._M_dataplus._M_p & 0xffffffff;
        uVar22 = uVar20;
        if (-1 < (int)(uint)s._M_dataplus._M_p) break;
      }
      cmStrCat<char_const(&)[35],std::__cxx11::string_const&,char_const(&)[30]>
                ((string *)&fin,(char (*) [35])"STRINGS option LIMIT_COUNT value \"",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar13,
                 (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00338b39;
    case 4:
      iVar9 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&s);
      if (iVar9 == 1) {
        local_4f8 = (uint)s._M_dataplus._M_p;
        uVar22 = uVar20;
        if (-1 < (int)(uint)s._M_dataplus._M_p) break;
      }
      cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                ((string *)&fin,(char (*) [38])"STRINGS option LENGTH_MINIMUM value \"",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar13,
                 (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00338b39;
    case 5:
      iVar9 = __isoc99_sscanf((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_dataplus._M_p,
                              "%d",&s);
      if (iVar9 == 1) {
        local_520 = (uint)s._M_dataplus._M_p;
        uVar22 = uVar20;
        if (-1 < (int)(uint)s._M_dataplus._M_p) break;
      }
      cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[30]>
                ((string *)&fin,(char (*) [38])"STRINGS option LENGTH_MAXIMUM value \"",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar13,
                 (char (*) [30])"\" is not an unsigned integer.");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00338b39;
    default:
      cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[2]>
                ((string *)&fin,(char (*) [33])"STRINGS given unknown argument \"",
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar13,(char (*) [2])0x761966);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00338b39:
      std::__cxx11::string::~string((string *)&fin);
      bVar4 = false;
      goto LAB_00338979;
    case 7:
      bVar5 = cmsys::RegularExpression::compile
                        (&regex,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar13);
      if (!bVar5) {
        cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[25]>
                  ((string *)&fin,(char (*) [29])"STRINGS option REGEX value \"",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar13,
                   (char (*) [25])"\" could not be compiled.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00338b39;
      }
      PVar7 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0159,false);
      local_534 = (uint)CONCAT71((int7)((ulong)puVar16 >> 8),1);
      if (PVar7 != OLD) {
        uVar22 = uVar20;
        if (PVar7 != WARN) break;
        pcVar1 = status->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fin,"CMAKE_POLICY_WARNING_CMP0159",(allocator<char> *)&s);
        bVar5 = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,(string *)&fin);
        std::__cxx11::string::~string((string *)&fin);
        if (bVar5) {
          pcVar1 = status->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&s,(cmPolicies *)0x9f,id);
          output._M_dataplus._M_p._0_1_ = 10;
          cmStrCat<std::__cxx11::string,char,char_const(&)[63]>
                    ((string *)&fin,&s,(char *)&output,
                     (char (*) [63])"For compatibility, CMake is leaving CMAKE_MATCH_<n> unchanged."
                    );
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&fin);
          std::__cxx11::string::~string((string *)&fin);
          std::__cxx11::string::~string((string *)&s);
        }
      }
      local_538 = 0;
      uVar22 = 0;
      break;
    case 8:
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-8");
      if (bVar5) {
        uVar22 = 1;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-16LE");
        if (bVar5) {
          uVar22 = 3;
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-16BE");
          if (bVar5) {
            uVar22 = 2;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-32LE");
            if (!bVar5) {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar13,"UTF-32BE"
                                     );
              local_530 = (pointer)CONCAT44(local_530._4_4_,4);
              uVar22 = uVar20;
              if (bVar5) break;
              cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[18]>
                        ((string *)&fin,(char (*) [26])"STRINGS option ENCODING \"",
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar13,
                         (char (*) [18])"\" not recognized.");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00338b39;
            }
            uVar22 = 5;
          }
        }
      }
      local_530 = (pointer)CONCAT44(local_530._4_4_,uVar22);
      uVar22 = 0;
    }
LAB_00337ee9:
    pbVar17 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  if (bVar4) {
    a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[41]>
              ((string *)&fin,a,(char (*) [41])"/CMakeFiles/FileCommandStringsBinaryFile");
    bVar4 = cmHexFileConverter::TryConvert(&fileName,(string *)&fin);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&fileName);
    }
    std::__cxx11::string::~string((string *)&fin);
  }
  std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
  bVar4 = (*(byte *)((long)auStack_448 + *(long *)(CONCAT71(uStack_467,fin) + -0x18)) & 5) == 0;
  if (!bVar4) {
    cmStrCat<char_const(&)[15],std::__cxx11::string&,char_const(&)[18]>
              (&s,(char (*) [15])"STRINGS file \"",&fileName,(char (*) [18])"\" cannot be read.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&s);
    goto LAB_0033896c;
  }
  BVar8 = cmsys::FStream::ReadBOM((istream *)&fin);
  if (BVar8 == BOM_None) {
    BVar8 = (BOM)local_530;
  }
  if ((BOM)local_530 != BOM_None) {
    BVar8 = (BOM)local_530;
  }
  uVar10 = 3;
  if ((BVar8 & ~BOM_UTF8) != BOM_UTF32BE) {
    uVar10 = (uint)((BVar8 & ~BOM_UTF8) == BOM_UTF16BE);
  }
  local_530 = (pointer)CONCAT44(local_530._4_4_,uVar10);
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.field_2._M_local_buf[0] = '\0';
  uVar13 = (ulong)local_4f8;
  uVar14 = (ulong)local_520;
  local_528 = 0;
  do {
    if (((int)local_4f0 != 0) &&
       (uVar15 = (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5, local_4f0 <= uVar15))
    goto LAB_003387fd;
    if (((-1 < limit_input) && (iVar9 = std::istream::tellg(), limit_input <= iVar9)) ||
       ((*(byte *)((long)auStack_448 + *(long *)(CONCAT71(uStack_467,fin) + -0x18)) & 5) != 0))
    break;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    output._M_dataplus._M_p = (pointer)&output.field_2;
    uVar10 = std::istream::get();
    iVar9 = (BOM)local_530;
    while( true ) {
      bVar5 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      cVar19 = (char)&fin;
      if (bVar5) break;
      uVar11 = std::istream::get();
      if ((*(byte *)((long)auStack_448 + *(long *)(CONCAT71(uStack_467,fin) + -0x18)) & 5) != 0) {
        std::istream::putback(cVar19);
        break;
      }
      uVar10 = uVar10 << 8 | uVar11;
    }
    if (BVar8 == BOM_UTF32LE) {
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    }
    else if (BVar8 == BOM_UTF16LE) {
      uVar10 = (uint)(ushort)((ushort)uVar10 << 8 | (ushort)uVar10 >> 8);
    }
    if (uVar10 == 0xd) {
      bVar5 = false;
    }
    else {
      if ((uVar10 < 0x100) &&
         (iVar9 = isprint(uVar10), (bool)(uVar10 == 10 & bVar6 | (uVar10 == 9 || iVar9 != 0)))) {
        std::__cxx11::string::push_back((char)&output);
      }
      else if (BVar8 == BOM_UTF8) {
        uVar18 = 0;
        for (uVar15 = 0; ((int)uVar18 == 0 && (uVar15 < 3)); uVar15 = uVar15 + 1) {
          if ((HandleStringsCommand::utf8_check_table[uVar15][0] & uVar10) ==
              (uint)HandleStringsCommand::utf8_check_table[uVar15][1]) {
            uVar18 = (ulong)((int)uVar15 + 2);
          }
          else {
            uVar18 = 0;
          }
        }
        for (iVar9 = 0; (int)uVar18 != iVar9; iVar9 = iVar9 + 1) {
          if ((iVar9 != 0) &&
             ((uVar10 = std::istream::get(), (uVar10 & 0xc0) != 0x80 ||
              ((*(uint *)((long)auStack_448 + *(long *)(CONCAT71(uStack_467,fin) + -0x18)) & 5) != 0
              )))) {
            std::istream::putback(cVar19);
            break;
          }
          std::__cxx11::string::push_back((char)&output);
        }
        if (output._M_string_length != uVar18) {
          for (uVar11 = 0; (ulong)uVar11 < output._M_string_length - 1; uVar11 = uVar11 + 1) {
            std::istream::putback(cVar19);
          }
          output._M_string_length = 0;
          *output._M_dataplus._M_p = '\0';
        }
      }
      if (uVar10 == 10 && !bVar6) {
        if ((s._M_string_length < uVar13) ||
           (((local_534 & 1) != 0 &&
            (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), !bVar5)))) {
LAB_00338710:
          s._M_string_length = 0;
          *s._M_dataplus._M_p = '\0';
          goto LAB_0033871e;
        }
        if ((local_538 & 1) != 0) {
          cmMakefile::ClearMatches(status->Makefile);
          cmMakefile::StoreMatches(status->Makefile,&regex);
        }
        uVar10 = (int)local_528 + (int)s._M_string_length + 1;
        local_528 = (ulong)uVar10;
        if ((limit_output < 0) || (bVar5 = true, (int)uVar10 < limit_output)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
          goto LAB_00338710;
        }
      }
      else {
        if (output._M_string_length == 0) {
          if ((s._M_string_length != 0 && uVar13 <= s._M_string_length) &&
             (((local_534 & 1) == 0 ||
              (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) {
            if ((local_538 & 1) != 0) {
              cmMakefile::ClearMatches(status->Makefile);
              cmMakefile::StoreMatches(status->Makefile,&regex);
            }
            uVar10 = (int)local_528 + (int)s._M_string_length + 1;
            local_528 = (ulong)uVar10;
            if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar10))
            goto LAB_003387c1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&strings,&s);
          }
          goto LAB_00338710;
        }
        std::__cxx11::string::append((string *)&s);
LAB_0033871e:
        bVar5 = false;
        if ((local_520 == 0) || (s._M_string_length != uVar14)) goto LAB_003387cf;
        if ((local_4f8 <= local_520) &&
           (((local_534 & 1) == 0 ||
            (bVar5 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar5)))) {
          if ((local_538 & 1) != 0) {
            cmMakefile::ClearMatches(status->Makefile);
            cmMakefile::StoreMatches(status->Makefile,&regex);
          }
          uVar10 = (int)local_528 + (int)s._M_string_length + 1;
          local_528 = (ulong)uVar10;
          if ((-1 < limit_output) && (bVar5 = true, limit_output <= (int)uVar10)) goto LAB_003387c1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&strings,&s);
        }
        bVar5 = false;
      }
LAB_003387c1:
      s._M_string_length = 0;
      *s._M_dataplus._M_p = '\0';
    }
LAB_003387cf:
    std::__cxx11::string::~string((string *)&output);
  } while (!bVar5);
  if ((int)local_4f0 == 0) {
    iVar9 = (int)local_528;
LAB_0033881e:
    if (((s._M_string_length != 0) && (uVar13 <= s._M_string_length)) &&
       (((local_534 & 1) == 0 ||
        (bVar6 = cmsys::RegularExpression::find(&regex,s._M_dataplus._M_p), bVar6)))) {
      if ((local_538 & 1) != 0) {
        cmMakefile::ClearMatches(status->Makefile);
        cmMakefile::StoreMatches(status->Makefile,&regex);
      }
      if ((limit_output < 0) || ((int)s._M_string_length + iVar9 + 1 < limit_output)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&strings,&s);
      }
    }
  }
  else {
    uVar15 = (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
LAB_003387fd:
    iVar9 = (int)local_528;
    if (uVar15 < local_4f0) goto LAB_0033881e;
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  local_530 = strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar17 = strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar17 != local_530;
      pbVar17 = pbVar17 + 1) {
    std::__cxx11::string::append((char *)&output);
    pcVar2 = (pbVar17->_M_dataplus)._M_p;
    sVar3 = pbVar17->_M_string_length;
    for (sVar21 = 0; sVar3 != sVar21; sVar21 = sVar21 + 1) {
      cVar19 = (char)&output;
      if (pcVar2[sVar21] == ';') {
        std::__cxx11::string::push_back(cVar19);
      }
      std::__cxx11::string::push_back(cVar19);
    }
  }
  value._M_str = output._M_dataplus._M_p;
  value._M_len = output._M_string_length;
  cmMakefile::AddDefinition(status->Makefile,psVar12,value);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&s);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
LAB_0033896c:
  std::ifstream::~ifstream(&fin);
LAB_00338979:
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&fileName);
  return bVar4;
}

Assistant:

bool HandleStringsCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("STRINGS requires a file name and output variable");
    return false;
  }

  // Get the file to read.
  std::string fileName = args[1];
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', args[1]);
  }

  // Get the variable in which to store the results.
  std::string const& outVar = args[2];

  // Parse the options.
  enum
  {
    arg_none,
    arg_limit_input,
    arg_limit_output,
    arg_limit_count,
    arg_length_minimum,
    arg_length_maximum,
    arg_maximum,
    arg_regex,
    arg_encoding
  };
  unsigned int minlen = 0;
  unsigned int maxlen = 0;
  int limit_input = -1;
  int limit_output = -1;
  unsigned int limit_count = 0;
  cmsys::RegularExpression regex;
  bool have_regex = false;
  bool store_regex = true;
  bool newline_consume = false;
  bool hex_conversion_enabled = true;
  enum
  {
    encoding_none = cmsys::FStream::BOM_None,
    encoding_utf8 = cmsys::FStream::BOM_UTF8,
    encoding_utf16le = cmsys::FStream::BOM_UTF16LE,
    encoding_utf16be = cmsys::FStream::BOM_UTF16BE,
    encoding_utf32le = cmsys::FStream::BOM_UTF32LE,
    encoding_utf32be = cmsys::FStream::BOM_UTF32BE
  };
  int encoding = encoding_none;
  int arg_mode = arg_none;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "LIMIT_INPUT") {
      arg_mode = arg_limit_input;
    } else if (args[i] == "LIMIT_OUTPUT") {
      arg_mode = arg_limit_output;
    } else if (args[i] == "LIMIT_COUNT") {
      arg_mode = arg_limit_count;
    } else if (args[i] == "LENGTH_MINIMUM") {
      arg_mode = arg_length_minimum;
    } else if (args[i] == "LENGTH_MAXIMUM") {
      arg_mode = arg_length_maximum;
    } else if (args[i] == "REGEX") {
      arg_mode = arg_regex;
    } else if (args[i] == "NEWLINE_CONSUME") {
      newline_consume = true;
      arg_mode = arg_none;
    } else if (args[i] == "NO_HEX_CONVERSION") {
      hex_conversion_enabled = false;
      arg_mode = arg_none;
    } else if (args[i] == "ENCODING") {
      arg_mode = arg_encoding;
    } else if (arg_mode == arg_limit_input) {
      if (sscanf(args[i].c_str(), "%d", &limit_input) != 1 ||
          limit_input < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_INPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_output) {
      if (sscanf(args[i].c_str(), "%d", &limit_output) != 1 ||
          limit_output < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_OUTPUT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_limit_count) {
      int count;
      if (sscanf(args[i].c_str(), "%d", &count) != 1 || count < 0) {
        status.SetError(cmStrCat("STRINGS option LIMIT_COUNT value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      limit_count = count;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_minimum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MINIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      minlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_length_maximum) {
      int len;
      if (sscanf(args[i].c_str(), "%d", &len) != 1 || len < 0) {
        status.SetError(cmStrCat("STRINGS option LENGTH_MAXIMUM value \"",
                                 args[i], "\" is not an unsigned integer."));
        return false;
      }
      maxlen = len;
      arg_mode = arg_none;
    } else if (arg_mode == arg_regex) {
      if (!regex.compile(args[i])) {
        status.SetError(cmStrCat("STRINGS option REGEX value \"", args[i],
                                 "\" could not be compiled."));
        return false;
      }
      have_regex = true;
      switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0159)) {
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          // store_regex = true
          break;
        case cmPolicies::WARN:
          if (status.GetMakefile().PolicyOptionalWarningEnabled(
                "CMAKE_POLICY_WARNING_CMP0159")) {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0159), '\n',
                       "For compatibility, CMake is leaving CMAKE_MATCH_<n> "
                       "unchanged."));
          }
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          store_regex = false;
          break;
      }
      arg_mode = arg_none;
    } else if (arg_mode == arg_encoding) {
      if (args[i] == "UTF-8") {
        encoding = encoding_utf8;
      } else if (args[i] == "UTF-16LE") {
        encoding = encoding_utf16le;
      } else if (args[i] == "UTF-16BE") {
        encoding = encoding_utf16be;
      } else if (args[i] == "UTF-32LE") {
        encoding = encoding_utf32le;
      } else if (args[i] == "UTF-32BE") {
        encoding = encoding_utf32be;
      } else {
        status.SetError(cmStrCat("STRINGS option ENCODING \"", args[i],
                                 "\" not recognized."));
        return false;
      }
      arg_mode = arg_none;
    } else {
      status.SetError(
        cmStrCat("STRINGS given unknown argument \"", args[i], "\""));
      return false;
    }
  }

  if (hex_conversion_enabled) {
    // TODO: should work without temp file, but just on a memory buffer
    std::string binaryFileName =
      cmStrCat(status.GetMakefile().GetCurrentBinaryDirectory(),
               "/CMakeFiles/FileCommandStringsBinaryFile");
    if (cmHexFileConverter::TryConvert(fileName, binaryFileName)) {
      fileName = binaryFileName;
    }
  }

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(fileName.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(fileName.c_str());
#endif
  if (!fin) {
    status.SetError(
      cmStrCat("STRINGS file \"", fileName, "\" cannot be read."));
    return false;
  }

  // If BOM is found and encoding was not specified, use the BOM
  int bom_found = cmsys::FStream::ReadBOM(fin);
  if (encoding == encoding_none && bom_found != cmsys::FStream::BOM_None) {
    encoding = bom_found;
  }

  unsigned int bytes_rem = 0;
  if (encoding == encoding_utf16le || encoding == encoding_utf16be) {
    bytes_rem = 1;
  }
  if (encoding == encoding_utf32le || encoding == encoding_utf32be) {
    bytes_rem = 3;
  }

  // Parse strings out of the file.
  int output_size = 0;
  std::vector<std::string> strings;
  std::string s;
  while ((!limit_count || strings.size() < limit_count) &&
         (limit_input < 0 || static_cast<int>(fin.tellg()) < limit_input) &&
         fin) {
    std::string current_str;

    int c = fin.get();
    for (unsigned int i = 0; i < bytes_rem; ++i) {
      int c1 = fin.get();
      if (!fin) {
        fin.putback(static_cast<char>(c1));
        break;
      }
      c = (c << 8) | c1;
    }
    if (encoding == encoding_utf16le) {
      c = ((c & 0xFF) << 8) | ((c & 0xFF00) >> 8);
    } else if (encoding == encoding_utf32le) {
      c = (((c & 0xFF) << 24) | ((c & 0xFF00) << 8) | ((c & 0xFF0000) >> 8) |
           ((c & 0xFF000000) >> 24));
    }

    if (c == '\r') {
      // Ignore CR character to make output always have UNIX newlines.
      continue;
    }

    if (c >= 0 && c <= 0xFF &&
        (isprint(c) || c == '\t' || (c == '\n' && newline_consume))) {
      // This is an ASCII character that may be part of a string.
      // Cast added to avoid compiler warning. Cast is ok because
      // c is guaranteed to fit in char by the above if...
      current_str += static_cast<char>(c);
    } else if (encoding == encoding_utf8) {
      // Check for UTF-8 encoded string (up to 4 octets)
      static const unsigned char utf8_check_table[3][2] = {
        { 0xE0, 0xC0 },
        { 0xF0, 0xE0 },
        { 0xF8, 0xF0 },
      };

      // how many octets are there?
      unsigned int num_utf8_bytes = 0;
      for (unsigned int j = 0; num_utf8_bytes == 0 && j < 3; j++) {
        if ((c & utf8_check_table[j][0]) == utf8_check_table[j][1]) {
          num_utf8_bytes = j + 2;
        }
      }

      // get subsequent octets and check that they are valid
      for (unsigned int j = 0; j < num_utf8_bytes; j++) {
        if (j != 0) {
          c = fin.get();
          if (!fin || (c & 0xC0) != 0x80) {
            fin.putback(static_cast<char>(c));
            break;
          }
        }
        current_str += static_cast<char>(c);
      }

      // if this was an invalid utf8 sequence, discard the data, and put
      // back subsequent characters
      if ((current_str.length() != num_utf8_bytes)) {
        for (unsigned int j = 0; j < current_str.size() - 1; j++) {
          fin.putback(current_str[current_str.size() - 1 - j]);
        }
        current_str.clear();
      }
    }

    if (c == '\n' && !newline_consume) {
      // The current line has been terminated.  Check if the current
      // string matches the requirements.  The length may now be as
      // low as zero since blank lines are allowed.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else if (current_str.empty()) {
      // A non-string character has been found.  Check if the current
      // string matches the requirements.  We require that the length
      // be at least one no matter what the user specified.
      if (s.length() >= minlen && !s.empty() &&
          (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }

      // Reset the string to empty.
      s.clear();
    } else {
      s += current_str;
    }

    if (maxlen > 0 && s.size() == maxlen) {
      // Terminate a string if the maximum length is reached.
      if (s.length() >= minlen && (!have_regex || regex.find(s))) {
        if (store_regex) {
          status.GetMakefile().ClearMatches();
          status.GetMakefile().StoreMatches(regex);
        }
        output_size += static_cast<int>(s.size()) + 1;
        if (limit_output >= 0 && output_size >= limit_output) {
          s.clear();
          break;
        }
        strings.push_back(s);
      }
      s.clear();
    }
  }

  // If there is a non-empty current string we have hit the end of the
  // input file or the input size limit.  Check if the current string
  // matches the requirements.
  if ((!limit_count || strings.size() < limit_count) && !s.empty() &&
      s.length() >= minlen && (!have_regex || regex.find(s))) {
    if (store_regex) {
      status.GetMakefile().ClearMatches();
      status.GetMakefile().StoreMatches(regex);
    }
    output_size += static_cast<int>(s.size()) + 1;
    if (limit_output < 0 || output_size < limit_output) {
      strings.push_back(s);
    }
  }

  // Encode the result in a CMake list.
  const char* sep = "";
  std::string output;
  for (std::string const& sr : strings) {
    // Separate the strings in the output to make it a list.
    output += sep;
    sep = ";";

    // Store the string in the output, but escape semicolons to
    // make sure it is a list.
    for (char i : sr) {
      if (i == ';') {
        output += '\\';
      }
      output += i;
    }
  }

  // Save the output in a makefile variable.
  status.GetMakefile().AddDefinition(outVar, output);
  return true;
}